

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

uint crnlib::rg_etc1::pack_etc2_alpha
               (void *pBlock,uint *pSrc_pixels_rgba,etc2a_pack_params *pack_params)

{
  sbyte sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint8 *local_558;
  uint local_548;
  uint local_540;
  uint delta;
  uint s;
  uint best_delta;
  uint best_s;
  uint bit_offset;
  uint byte_offset;
  int a;
  uint j;
  uint d;
  uint i_1;
  uint t;
  uint d0;
  uint error;
  int i;
  uint8 values [8];
  uint8 data [8];
  int multiplier;
  int *modifier;
  int modifier_index;
  uint best_error;
  uint base_codeword;
  undefined1 local_4d8 [8];
  params params;
  uint8 selectors [16];
  undefined1 local_4a0 [8];
  results results;
  dxt5_endpoint_optimizer dxt5_optimizer;
  color_quad_u8 *pixels;
  etc2a_pack_params *pack_params_local;
  uint *pSrc_pixels_rgba_local;
  void *pBlock_local;
  
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer
            ((dxt5_endpoint_optimizer *)&results.m_first_endpoint);
  local_4a0 = (undefined1  [8])&params.m_quality;
  dxt5_endpoint_optimizer::params::params((params *)local_4d8);
  params.m_pPixels._0_4_ = 0x10;
  params.m_pPixels._4_4_ = pack_params->comp_index;
  if (pack_params->m_quality == cHighQuality) {
    local_548 = 4;
  }
  else {
    local_548 = 1;
    if (pack_params->m_quality == cMediumQuality) {
      local_548 = 2;
    }
  }
  params.m_num_pixels = local_548;
  params.m_comp_index._0_1_ = 0;
  params._0_8_ = pSrc_pixels_rgba;
  dxt5_endpoint_optimizer::compute
            ((dxt5_endpoint_optimizer *)&results.m_first_endpoint,(params *)local_4d8,
             (results *)local_4a0);
  iVar2 = (int)((uint)(byte)results.m_error + (uint)results.m_error._1_1_ + 1) >> 1;
  modifier._4_4_ = 0xffffffff;
  for (modifier._0_4_ = 0; (int)modifier < 0x10; modifier._0_4_ = (int)modifier + 1) {
    register0x00000000 = g_etc2a_modifier_table + (long)(int)modifier * 0x20;
    iVar3 = *(int *)(g_etc2a_modifier_table + (long)(int)modifier * 0x20 + 0x1c);
    iVar3 = math::clamp<int>((int)(((uint)(byte)results.m_error - (uint)results.m_error._1_1_) +
                                   iVar3 + (iVar3 >> 1)) / (iVar3 * 2),1,0xf);
    data[0] = (char)iVar3;
    data[1] = (char)((uint)iVar3 >> 8);
    data[2] = (char)((uint)iVar3 >> 0x10);
    data[3] = (char)((uint)iVar3 >> 0x18);
    values[0] = (uint8)iVar2;
    values[1] = (byte)(iVar3 << 4) | (byte)(int)modifier;
    local_558 = values + 2;
    do {
      *local_558 = '\0';
      local_558 = local_558 + 1;
    } while (local_558 != data);
    for (d0 = 0; (int)d0 < 8; d0 = d0 + 1) {
      iVar3 = math::clamp<int>(iVar2 + *(int *)(stack0xfffffffffffffb08 + (long)(int)d0 * 4) *
                                       data._0_4_,0,0xff);
      *(char *)((long)&error + (long)(int)d0) = (char)iVar3;
    }
    t = 0;
    i_1 = 3;
    d = 0;
    for (j = 0; j < 4; j = j + 1) {
      a = i_1;
      for (byte_offset = 0; byte_offset < 4; byte_offset = byte_offset + 1) {
        uVar4 = ((uint)a >> 3) + 2;
        s = 0;
        delta = 0xffffffff;
        for (local_540 = 0; local_540 < 8; local_540 = local_540 + 1) {
          uVar5 = (uint)*(byte *)((long)pSrc_pixels_rgba + (ulong)d * 4 + 3) -
                  (uint)*(byte *)((long)&error + (ulong)local_540);
          if ((int)uVar5 < 1) {
            uVar5 = -uVar5;
          }
          if (uVar5 < delta) {
            s = local_540;
            delta = uVar5;
          }
        }
        t = delta * delta + t;
        sVar1 = (sbyte)(a & 7U);
        values[uVar4] = values[uVar4] | (byte)(s << (8U - sVar1 & 0x1f));
        if ((a & 7U) < 3) {
          uVar4 = ((uint)a >> 3) + 1;
          values[uVar4] = values[uVar4] | (byte)(s >> sVar1);
        }
        d = d + 1;
        a = a + 0xc;
      }
      i_1 = i_1 + 3;
    }
    if (t < modifier._4_4_) {
      *(ulong *)pBlock = CONCAT62(values._2_6_,CONCAT11(values[1],values[0]));
      modifier._4_4_ = t;
    }
  }
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer
            ((dxt5_endpoint_optimizer *)&results.m_first_endpoint);
  return modifier._4_4_;
}

Assistant:

unsigned int pack_etc2_alpha(void* pBlock, const unsigned int* pSrc_pixels_rgba, etc2a_pack_params& pack_params)
        {
            crnlib::color_quad_u8* pixels = (crnlib::color_quad_u8*)pSrc_pixels_rgba;
            dxt5_endpoint_optimizer dxt5_optimizer;

            dxt5_endpoint_optimizer::results results;
            uint8 selectors[16];
            results.m_pSelectors = selectors;

            dxt5_endpoint_optimizer::params params;
            params.m_pPixels = pixels;
            params.m_num_pixels = 16;
            params.m_comp_index = pack_params.comp_index;
            params.m_quality = pack_params.m_quality == cHighQuality ? cCRNDXTQualityUber : pack_params.m_quality == cMediumQuality ? cCRNDXTQualityNormal
                                                                                                                                    : cCRNDXTQualityFast;
            params.m_use_both_block_types = false;
            dxt5_optimizer.compute(params, results);

            uint base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
            uint best_error = cUINT32_MAX;
            for (int modifier_index = 0; modifier_index < 16; modifier_index++)
            {
                const int* modifier = g_etc2a_modifier_table[modifier_index];
                int multiplier = math::clamp<int>((results.m_first_endpoint - results.m_second_endpoint + modifier[7] + (modifier[7] >> 1)) / (modifier[7] << 1), 1, 15);
                uint8 data[8] = { (uint8)base_codeword, (uint8)(multiplier << 4 | modifier_index) }, values[8];
                for (int i = 0; i < 8; i++)
                {
                    values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
                }
                uint error = 0;
                for (uint d0 = 3, t = 0, i = 0; i < 4; i++, d0 += 3)
                {
                    for (uint d = d0, j = 0; j < 4; j++, t++, d += 12)
                    {
                        int a = pixels[t].a;
                        uint byte_offset = 2 + (d >> 3);
                        uint bit_offset = d & 7;
                        uint best_s = 0;
                        uint best_delta = cUINT32_MAX;
                        for (uint s = 0; s < 8; s++)
                        {
                            uint delta = abs(a - values[s]);
                            if (delta < best_delta)
                            {
                                best_s = s;
                                best_delta = delta;
                            }
                        }
                        error += best_delta * best_delta;
                        data[byte_offset] |= best_s << (8 - bit_offset);
                        if (bit_offset < 3)
                        {
                            data[byte_offset - 1] |= best_s >> bit_offset;
                        }
                    }
                }
                if (error < best_error)
                {
                    memcpy(pBlock, data, 8);
                    best_error = error;
                }
            }

            return best_error;
        }